

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall icu_63::OffsetList::popMinimum(OffsetList *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = this->start;
  lVar4 = (long)iVar1;
  iVar2 = this->capacity;
  iVar5 = iVar1;
  do {
    lVar4 = lVar4 + 1;
    if (iVar2 <= lVar4) {
      lVar4 = -1;
      do {
        lVar3 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (this->list[lVar3] == '\0');
      this->list[lVar4] = '\0';
      this->length = this->length + -1;
      this->start = (int)lVar4;
      return (iVar2 - iVar1) + (int)lVar4;
    }
    iVar5 = iVar5 + 1;
  } while (this->list[lVar4] == '\0');
  this->list[lVar4] = '\0';
  this->length = this->length + -1;
  iVar1 = this->start;
  this->start = iVar5;
  return iVar5 - iVar1;
}

Assistant:

int32_t popMinimum() {
        // Look for the next offset in list[start+1..capacity-1].
        int32_t i=start, result;
        while(++i<capacity) {
            if(list[i]) {
                list[i]=FALSE;
                --length;
                result=i-start;
                start=i;
                return result;
            }
        }
        // i==capacity

        // Wrap around and look for the next offset in list[0..start].
        // Since the list is not empty, there will be one.
        result=capacity-start;
        i=0;
        while(!list[i]) {
            ++i;
        }
        list[i]=FALSE;
        --length;
        start=i;
        return result+=i;
    }